

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,int saveSqlFlag,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  void *pvVar1;
  int iVar2;
  int local_4c;
  int chars_parsed;
  int rc;
  char *zTail8;
  char *zSql8;
  void **pzTail_local;
  sqlite3_stmt **ppStmt_local;
  int saveSqlFlag_local;
  int nBytes_local;
  void *zSql_local;
  sqlite3 *db_local;
  
  _chars_parsed = (char *)0x0;
  local_4c = 0;
  *ppStmt = (sqlite3_stmt *)0x0;
  zSql8 = (char *)pzTail;
  pzTail_local = ppStmt;
  ppStmt_local._0_4_ = saveSqlFlag;
  ppStmt_local._4_4_ = nBytes;
  _saveSqlFlag_local = zSql;
  zSql_local = db;
  iVar2 = sqlite3SafetyCheckOk(db);
  if (iVar2 == 0) {
    db_local._4_4_ = sqlite3MisuseError(0x1770d);
  }
  else {
    sqlite3_mutex_enter(*(sqlite3_mutex **)((long)zSql_local + 0x18));
    zTail8 = sqlite3Utf16to8((sqlite3 *)zSql_local,_saveSqlFlag_local,ppStmt_local._4_4_,'\x02');
    if (zTail8 != (char *)0x0) {
      local_4c = sqlite3LockAndPrepare
                           ((sqlite3 *)zSql_local,zTail8,-1,(int)ppStmt_local,(Vdbe *)0x0,
                            (sqlite3_stmt **)pzTail_local,(char **)&chars_parsed);
    }
    if ((_chars_parsed != (char *)0x0) && (zSql8 != (char *)0x0)) {
      iVar2 = sqlite3Utf8CharLen(zTail8,(int)_chars_parsed - (int)zTail8);
      pvVar1 = _saveSqlFlag_local;
      iVar2 = sqlite3Utf16ByteLen(_saveSqlFlag_local,iVar2);
      *(long *)zSql8 = (long)pvVar1 + (long)iVar2;
    }
    sqlite3DbFree((sqlite3 *)zSql_local,zTail8);
    iVar2 = sqlite3ApiExit((sqlite3 *)zSql_local,local_4c);
    sqlite3_mutex_leave(*(sqlite3_mutex **)((long)zSql_local + 0x18));
    db_local._4_4_ = iVar2;
  }
  return db_local._4_4_;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */ 
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  int saveSqlFlag,          /* True to save SQL text into the sqlite3_stmt */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

  assert( ppStmt );
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, saveSqlFlag, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8); 
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}